

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall DSBarInfo::~DSBarInfo(DSBarInfo *this)

{
  void *in_RSI;
  
  ~DSBarInfo(this);
  DObject::operator_delete((DObject *)this,in_RSI);
  return;
}

Assistant:

~DSBarInfo ()
	{
		Images.Uninit();
	}